

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_binary.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  short extraout_AX;
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLint GVar5;
  int extraout_EAX;
  PFNGLBINDATTRIBLOCATIONPROC *pp_Var6;
  FILE *pFVar7;
  void *__ptr;
  PFNGLCOMPILESHADERPROC *pp_Var8;
  PFNGLGETPROGRAMIVPROC *pp_Var9;
  PFNGLCREATESHADERPROC *unaff_R12;
  PFNGLGETSHADERIVPROC *unaff_R13;
  PFNGLGETERRORPROC *pp_Var10;
  size_t __size;
  GLint *pGVar11;
  PFNGLSHADERSOURCEPROC *unaff_R15;
  bool bVar12;
  GLenum binaryFormat;
  GLint status;
  GLsizei length;
  GLint binaryLength;
  GLuint GStack_4f8;
  GLuint GStack_4f4;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined8 uStack_4bc;
  GLfloat aGStack_4b0 [18];
  PFNGLBINDATTRIBLOCATIONPROC *pp_Stack_468;
  PFNGLCREATESHADERPROC *pp_Stack_460;
  PFNGLGETSHADERIVPROC *pp_Stack_458;
  GLint *pGStack_450;
  PFNGLSHADERSOURCEPROC *pp_Stack_448;
  PFNGLGETPROGRAMIVPROC *pp_Stack_440;
  undefined8 local_434;
  undefined1 local_42c [16];
  GLuint local_41c;
  PFNGLSHADERSOURCEPROC local_418 [125];
  
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107dbc;
  pp_Var6 = (PFNGLBINDATTRIBLOCATIONPROC *)getenv("DRY_RUN");
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107dc4;
  glfwInit();
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107dd0;
  glfwWindowHint(0x20004,0);
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107ddf;
  glfwWindowHint(0x22002,3);
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107dee;
  glfwWindowHint(0x22003,2);
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107e02;
  glfwWindowHint(0x22006,1);
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107e11;
  glfwWindowHint(0x22008,0x32001);
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107e20;
  glfwWindowHint(0x22007,1);
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107e37;
  window = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    return 0x7d;
  }
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107e4f;
  glfwMakeContextCurrent(window);
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107e5b;
  iVar1 = gladLoadGLLoader(glfwGetProcAddress);
  if (iVar1 == 0) {
    return 1;
  }
  if (GLAD_GL_KHR_debug != 0) {
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107e81;
    (*glad_glDebugMessageCallback)(debugMessageCallback,(void *)0x0);
  }
  if (GLAD_GL_ARB_get_program_binary == 0 && GLAD_GL_VERSION_4_1 == 0) {
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108319;
    exit(0x7d);
  }
  pp_Var9 = (PFNGLGETPROGRAMIVPROC *)(ulong)(pp_Var6 == (PFNGLBINDATTRIBLOCATIONPROC *)0x0);
  local_42c._0_4_ = 0;
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107ec2;
  local_42c._4_8_ = pp_Var6;
  (*glad_glGetIntegerv)(0x87fe,(GLint *)local_42c);
  pGVar11 = (GLint *)(ulong)(uint)local_42c._0_4_;
  if ((pp_Var6 == (PFNGLBINDATTRIBLOCATIONPROC *)0x0 && local_42c._0_4_ != 0) ||
     ((int)local_42c._0_4_ < 0)) {
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108321;
    main_cold_8();
LAB_00108321:
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108326;
    main_cold_1();
    pp_Var8 = (PFNGLCOMPILESHADERPROC *)&glad_glGetIntegerv;
LAB_00108326:
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108337;
    main_cold_7();
LAB_00108337:
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108349;
    main_cold_6();
    pp_Var10 = (PFNGLGETERRORPROC *)unaff_R13;
LAB_00108349:
    pp_Var6 = (PFNGLBINDATTRIBLOCATIONPROC *)pp_Var8;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108358;
    main_cold_5();
  }
  else {
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107eeb;
    unaff_R15 = (PFNGLSHADERSOURCEPROC *)operator_new__((long)pGVar11 * 4 + 4);
    pp_Var9 = (PFNGLGETPROGRAMIVPROC *)0xbadf00d;
    *(GLint *)((long)unaff_R15 + (long)pGVar11 * 4) = 0xbadf00d;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107f01;
    (*glad_glGetIntegerv)(0x87ff,(GLint *)unaff_R15);
    if (*(int *)((long)unaff_R15 + (long)(int)local_42c._0_4_ * 4) != 0xbadf00d) goto LAB_00108321;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107f34;
    (*glad_glClearColor)(0.3,0.1,0.3,1.0);
    unaff_R12 = &glad_glCreateShader;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107f44;
    GVar2 = (*glad_glCreateShader)(0x8b30);
    pp_Var9 = (PFNGLGETPROGRAMIVPROC *)(ulong)GVar2;
    unaff_R15 = &glad_glShaderSource;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107f60;
    (*glad_glShaderSource)(GVar2,1,&init()::fragShaderText,(GLint *)0x0);
    pp_Var8 = &glad_glCompileShader;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107f6b;
    (*glad_glCompileShader)(GVar2);
    unaff_R13 = &glad_glGetShaderiv;
    pGVar11 = (GLint *)&local_434;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107f85;
    (*glad_glGetShaderiv)(GVar2,0x8b81,pGVar11);
    if ((GLenum)local_434 == 0) goto LAB_00108326;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107f98;
    GVar3 = (*glad_glCreateShader)(0x8b31);
    pGVar11 = (GLint *)(ulong)GVar3;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107fae;
    (*glad_glShaderSource)(GVar3,1,&init()::vertShaderText,(GLint *)0x0);
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107fb3;
    (*glad_glCompileShader)(GVar3);
    unaff_R15 = (PFNGLSHADERSOURCEPROC *)&local_434;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107fc7;
    (*glad_glGetShaderiv)(GVar3,0x8b81,(GLint *)unaff_R15);
    if ((GLenum)local_434 == 0) goto LAB_00108337;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107fda;
    program = (*glad_glCreateProgram)();
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107ff1;
    local_41c = GVar2;
    (*glad_glAttachShader)(program,GVar2);
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x107ffc;
    (*glad_glAttachShader)(program,GVar3);
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108014;
    (*glad_glBindAttribLocation)(program,0,"pos");
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108028;
    (*glad_glBindAttribLocation)(program,1,"color");
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108041;
    (*glad_glProgramParameteri)(program,0x8257,1);
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108050;
    (*glad_glLinkProgram)(program);
    pp_Var9 = &glad_glGetProgramiv;
    unaff_R15 = (PFNGLSHADERSOURCEPROC *)&local_434;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10806d;
    (*glad_glGetProgramiv)(program,0x8b82,(GLint *)unaff_R15);
    pp_Var6 = (PFNGLBINDATTRIBLOCATIONPROC *)local_42c._4_8_;
    pp_Var8 = (PFNGLCOMPILESHADERPROC *)&glad_glBindAttribLocation;
    pp_Var10 = (PFNGLGETERRORPROC *)unaff_R13;
    if ((GLenum)local_434 == 0) goto LAB_00108349;
    bVar12 = (PFNGLBINDATTRIBLOCATIONPROC *)local_42c._4_8_ == (PFNGLBINDATTRIBLOCATIONPROC *)0x0;
    pp_Var10 = (PFNGLGETERRORPROC *)CONCAT71(0x16ce,bVar12);
    unaff_R12 = (PFNGLCREATESHADERPROC *)local_42c;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10809f;
    glfwGetFramebufferSize(window,(int *)local_418,(int *)unaff_R12);
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1080b3;
    (*glad_glViewport)(0,0,(GLsizei)local_418[0],local_42c._0_4_);
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1080b8;
    draw();
    local_418[0]._0_4_ = 0;
    unaff_R15 = local_418;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1080d5;
    (*glad_glGetProgramiv)(program,0x8741,(GLint *)unaff_R15);
    GVar2 = local_41c;
    if ((bVar12 && (GLsizei)local_418[0] != 0) || ((GLsizei)local_418[0] < 0)) goto LAB_00108362;
    pp_Var10 = &glad_glGetError;
    pp_Var9 = (PFNGLGETPROGRAMIVPROC *)(ulong)local_41c;
    do {
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1080fd;
      GVar4 = (*glad_glGetError)();
    } while (GVar4 != 0);
    iVar1 = 0x2000000;
    if (0 < (GLsizei)local_418[0]) {
      iVar1 = (GLsizei)local_418[0];
    }
    unaff_R12 = (PFNGLCREATESHADERPROC *)(long)iVar1;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10811a;
    unaff_R15 = (PFNGLSHADERSOURCEPROC *)malloc((size_t)unaff_R12);
    local_42c._0_4_ = 0;
    local_434._0_4_ = 0;
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108142;
    (*glad_glGetProgramBinary)(program,iVar1,(GLsizei *)local_42c,(GLenum *)&local_434,unaff_R15);
    pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108146;
    GVar4 = (*glad_glGetError)();
    if ((pp_Var6 != (PFNGLBINDATTRIBLOCATIONPROC *)0x0) || (GVar4 != 0)) {
      if (pp_Var6 != (PFNGLBINDATTRIBLOCATIONPROC *)0x0) {
        pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10816b;
        pFVar7 = fopen("program_binary.bin","wb");
        pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108185;
        fwrite(&local_434,4,1,pFVar7);
        pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10819f;
        fwrite(local_418,4,1,pFVar7);
        pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1081b3;
        fwrite(unaff_R15,1,(long)(GLsizei)local_418[0],pFVar7);
        pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1081bb;
        fclose(pFVar7);
      }
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1081c3;
      free(unaff_R15);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1081ce;
      (*glad_glDeleteShader)(GVar2);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1081d3;
      (*glad_glDeleteShader)(GVar3);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1081e2;
      (*glad_glDeleteProgram)(program);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1081eb;
      program = (*glad_glCreateProgram)();
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108204;
      pFVar7 = fopen("program_binary.bin","rb");
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108221;
      fread(&local_434,4,1,pFVar7);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10823b;
      fread(local_418,4,1,pFVar7);
      __size = (size_t)(GLsizei)local_418[0];
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108247;
      __ptr = malloc(__size);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10825d;
      fread(__ptr,1,__size,pFVar7);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108265;
      fclose(pFVar7);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10827e;
      (*glad_glProgramBinary)(program,(GLenum)local_434,__ptr,(GLsizei)local_418[0]);
      local_434._4_4_ = 0;
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1082a1;
      (*glad_glGetProgramiv)(program,0x8b82,(GLint *)((long)&local_434 + 4));
      if (local_434._4_4_ == 0) {
        pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1082f8;
        main_cold_2();
        if (extraout_AX != 1) {
          if (extraout_AX == 0) goto LAB_00108305;
          goto LAB_001082b4;
        }
      }
      else if ((PFNGLBINDATTRIBLOCATIONPROC *)local_42c._4_8_ == (PFNGLBINDATTRIBLOCATIONPROC *)0x0)
      {
LAB_00108305:
        pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x10830f;
        exit(1);
      }
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1082b4;
      draw();
LAB_001082b4:
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1082c0;
      glfwDestroyWindow(window);
      pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x1082c5;
      glfwTerminate();
      return 0;
    }
  }
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)0x108362;
  main_cold_3();
LAB_00108362:
  pp_Stack_440 = (PFNGLGETPROGRAMIVPROC *)draw;
  main_cold_4();
  pp_Stack_468 = pp_Var6;
  pp_Stack_460 = unaff_R12;
  pp_Stack_458 = (PFNGLGETSHADERIVPROC *)pp_Var10;
  pGStack_450 = pGVar11;
  pp_Stack_448 = unaff_R15;
  pp_Stack_440 = pp_Var9;
  (*glad_glBindFragDataLocation)(program,0,"f_color");
  (*glad_glUseProgram)(program);
  GVar2 = (*glad_glGetAttribLocation)(program,"pos");
  GVar3 = (*glad_glGetAttribLocation)(program,"color");
  GVar5 = (*glad_glGetUniformLocation)(program,"modelviewProjection");
  uStack_4c0 = 0;
  uStack_4bc = 0x3f33333300000000;
  uStack_4d0 = 0x3f666666;
  uStack_4c8 = 0;
  uStack_4c4 = 0x3f666666;
  uStack_4e0 = 0x3f66666600000000;
  uStack_4d8 = 0xbf666666;
  uStack_4f0 = 0xbf666666bf666666;
  uStack_4e8 = 0x3f4ccccd;
  aGStack_4b0[2] = 0.0;
  aGStack_4b0[3] = 0.0;
  aGStack_4b0[6] = 0.0;
  aGStack_4b0[7] = 0.0;
  aGStack_4b0[8] = 0.0;
  aGStack_4b0[9] = 0.0;
  aGStack_4b0[0xc] = 0.0;
  aGStack_4b0[0xd] = 0.0;
  aGStack_4b0[0] = 1.0;
  aGStack_4b0[1] = 0.0;
  aGStack_4b0[4] = 0.0;
  aGStack_4b0[5] = 1.0;
  aGStack_4b0[10] = 1.0;
  aGStack_4b0[0xb] = 0.0;
  aGStack_4b0[0xe] = 0.0;
  aGStack_4b0[0xf] = 1.0;
  (*glad_glGenBuffers)(1,&GStack_4f4);
  (*glad_glUniformMatrix4fv)(GVar5,1,'\0',aGStack_4b0);
  (*glad_glClear)(0x4000);
  (*glad_glGenVertexArrays)(1,&GStack_4f8);
  (*glad_glBindVertexArray)(GStack_4f8);
  (*glad_glBindBuffer)(0x8892,GStack_4f4);
  (*glad_glBufferData)(0x8892,0x3c,&uStack_4f0,0x88e4);
  (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',0x14,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(GVar2);
  (*glad_glVertexAttribPointer)(GVar3,3,0x1406,'\0',0x14,(void *)0x8);
  (*glad_glEnableVertexAttribArray)(GVar3);
  (*glad_glDrawArrays)(4,0,3);
  (*glad_glDisableVertexAttribArray)(GVar2);
  (*glad_glDisableVertexAttribArray)(GVar3);
  (*glad_glUseProgram)(0);
  glfwSwapBuffers(window);
  return extraout_EAX;
}

Assistant:

int
main(int argc, char *argv[])
{
    tracing = !getenv("DRY_RUN");

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
         return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
       return EXIT_FAILURE;
    }

    if (GLAD_GL_KHR_debug) {
        glDebugMessageCallback(&debugMessageCallback, NULL);
    }

    init();
    reshape();
    draw();

    GLint binaryLength = 0;
    glGetProgramiv(program, GL_PROGRAM_BINARY_LENGTH, &binaryLength);
    if ((tracing && binaryLength != 0) ||
        binaryLength < 0) {
        fprintf(stderr, "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n", binaryLength);
        exit(EXIT_FAILURE);
    }

    while (glGetError() != GL_NO_ERROR) ;

    GLsizei bufSize = binaryLength > 0 ? binaryLength : 32 * 1024 * 1024;
    void *binary = malloc(bufSize);
    GLsizei length = 0;
    GLenum binaryFormat = GL_NONE;
    glGetProgramBinary(program, bufSize, &length, &binaryFormat, binary);
    GLenum error = glGetError();
    if (tracing && error == GL_NO_ERROR) {
        fprintf(stderr, "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n", binaryLength);
        exit(EXIT_FAILURE);
    }

    FILE *fp;

    if (!tracing) {
        fp = fopen("program_binary.bin", "wb");
        fwrite(&binaryFormat, sizeof binaryFormat, 1, fp);
        fwrite(&binaryLength, sizeof binaryLength, 1, fp);
        fwrite(binary, 1, binaryLength, fp);
        fclose(fp);
    }

    free(binary);
   
    glDeleteShader(fragShader);
    glDeleteShader(vertShader);
    glDeleteProgram(program);

    program = glCreateProgram();

    fp = fopen("program_binary.bin", "rb");
    fread(&binaryFormat, sizeof binaryFormat, 1, fp);
    fread(&binaryLength, sizeof binaryLength, 1, fp);
    binary = malloc(binaryLength);
    fread(binary, 1, binaryLength, fp);
    fclose(fp);

    glProgramBinary(program, binaryFormat, binary, binaryLength);
    
    GLint status = 0;
    glGetProgramiv(program, GL_LINK_STATUS, &status);
    if (!status) {
        GLsizei len;
        char log[1000];
        glGetProgramInfoLog(program, sizeof log, &len, log);
        fprintf(stderr, "warning: glProgramBinary failed -- %s\n", log);
    }
    if (tracing && status) {
        exit(EXIT_FAILURE);
    }

    if (status) {
        draw();
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}